

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_fourier.cc
# Opt level: O3

int webrtc::RealFourier::FftOrder(size_t length)

{
  int iVar1;
  string *result;
  int iVar2;
  uint uVar3;
  uint uVar4;
  unsigned_long in_RDI;
  unsigned_long local_188;
  FatalMessage local_180;
  
  local_180.stream_ = (ostringstream)0x0;
  local_180._1_3_ = 0;
  if ((in_RDI == 0) &&
     (local_188 = in_RDI,
     result = rtc::MakeCheckOpString<unsigned_long,unsigned_int>
                        (&local_188,(uint *)&local_180,"length > 0U"), in_RDI = local_188,
     result != (string *)0x0)) {
    rtc::FatalMessage::FatalMessage
              (&local_180,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/real_fourier.cc"
               ,0x21,result);
    rtc::FatalMessage::~FatalMessage(&local_180);
  }
  uVar4 = (int)in_RDI - 1;
  iVar2 = (uint)(0xffff < uVar4) * 0x10;
  iVar1 = iVar2 + 8;
  if ((uVar4 >> (sbyte)iVar2 & 0xff00) == 0) {
    iVar1 = iVar2;
  }
  iVar2 = iVar1 + 4;
  if ((uVar4 >> ((byte)iVar1 & 0x1f) & 0xf0) == 0) {
    iVar2 = iVar1;
  }
  iVar1 = iVar2 + 2;
  if ((uVar4 >> ((byte)iVar2 & 0x1f) & 0xc) == 0) {
    iVar1 = iVar2;
  }
  uVar3 = (uVar4 >> ((byte)iVar1 & 0x1f) & 2) >> 1;
  return (int)(ushort)((short)uVar3 + (short)iVar1 +
                      (ushort)((uVar4 >> (uVar3 + iVar1 & 0x1f) & 1) != 0));
}

Assistant:

int RealFourier::FftOrder(size_t length) {
  RTC_CHECK_GT(length, 0U);
  return WebRtcSpl_GetSizeInBits(static_cast<uint32_t>(length - 1));
}